

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O3

int cm_zlib_gzungetc(int c,gzFile file)

{
  bool bVar1;
  
  if ((((file != (gzFile)0x0) && (c != -1)) && (*(char *)((long)file + 0xac) == 'r')) &&
     (*(int *)((long)file + 200) == -1)) {
    *(int *)((long)file + 200) = c;
    *(long *)((long)file + 0xc0) = *(long *)((long)file + 0xc0) + -1;
    bVar1 = *(int *)((long)file + 0x70) == 1;
    *(uint *)((long)file + 0xcc) = (uint)bVar1;
    if (bVar1) {
      *(undefined4 *)((long)file + 0x70) = 0;
    }
    *(undefined4 *)((long)file + 0x74) = 0;
    return c;
  }
  return -1;
}

Assistant:

int ZEXPORT gzungetc(c, file)
    int c;
    gzFile file;
{
    gz_stream *s = (gz_stream*)file;

    if (s == NULL || s->mode != 'r' || c == EOF || s->back != EOF) return EOF;
    s->back = c;
    s->out--;
    s->last = (s->z_err == Z_STREAM_END);
    if (s->last) s->z_err = Z_OK;
    s->z_eof = 0;
    return c;
}